

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_17::MthdSifmPitch::emulate_mthd(MthdSifmPitch *this)

{
  MthdSifmPitch *this_local;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xfffffbff | 0x400
  ;
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type < 4) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dma_pitch =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dma_pitch & 0xffff0000 |
         (this->super_SingleMthdTest).super_MthdTest.val & 0xffff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xffffbfff;
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.cls != 0x37) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.sifm_mode =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.sifm_mode & 0xfffcffff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2e) >> 0x3e) << 0x10);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.sifm_mode =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.sifm_mode & 0xfeffffff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x27) >> 0x3f) << 0x18);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		insrt(exp.valid[0], 10, 1, 1);
		if (chipset.card_type < 4) {
			insrt(exp.dma_pitch, 0, 16, val);
			insrt(exp.valid[0], 14, 1, 0);
		} else {
			if (cls != 0x37) {
				insrt(exp.sifm_mode, 16, 2, extr(val, 16, 2));
				insrt(exp.sifm_mode, 24, 1, extr(val, 24, 1));
			}
		}
	}